

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

cmd_ln_t * parse_options(cmd_ln_t *cmdln,arg_t *defn,int32 argc,char **argv,int32 strict)

{
  cmd_ln_t *pcVar1;
  char **ppcVar2;
  ulong uVar3;
  
  pcVar1 = cmd_ln_parse_r(cmdln,defn,argc,argv,strict);
  if (pcVar1 == (cmd_ln_t *)0x0) {
    if (0 < argc) {
      uVar3 = 0;
      do {
        ckd_free(argv[uVar3]);
        uVar3 = uVar3 + 1;
      } while ((uint)argc != uVar3);
    }
    ckd_free(argv);
    pcVar1 = (cmd_ln_t *)0x0;
  }
  else if (pcVar1 == cmdln) {
    ppcVar2 = (char **)__ckd_realloc__(pcVar1->f_argv,(ulong)(pcVar1->f_argc + argc) << 3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                       ,0x1ca);
    pcVar1->f_argv = ppcVar2;
    memcpy(ppcVar2 + pcVar1->f_argc,argv,(long)argc << 3);
    ckd_free(argv);
    pcVar1->f_argc = pcVar1->f_argc + argc;
  }
  else {
    pcVar1->f_argc = argc;
    pcVar1->f_argv = argv;
  }
  return pcVar1;
}

Assistant:

static cmd_ln_t *
parse_options(cmd_ln_t *cmdln, const arg_t *defn, int32 argc, char* argv[], int32 strict)
{
    cmd_ln_t *new_cmdln;

    new_cmdln = cmd_ln_parse_r(cmdln, defn, argc, argv, strict);
    /* If this failed then clean up and return NULL. */
    if (new_cmdln == NULL) {
        int32 i;
        for (i = 0; i < argc; ++i)
            ckd_free(argv[i]);
        ckd_free(argv);
        return NULL;
    }

    /* Otherwise, we need to add the contents of f_argv to the new object. */
    if (new_cmdln == cmdln) {
        /* If we are adding to a previously passed-in cmdln, then
         * store our allocated strings in its f_argv. */
        new_cmdln->f_argv = (char **)ckd_realloc(new_cmdln->f_argv,
                                        (new_cmdln->f_argc + argc)
                                        * sizeof(*new_cmdln->f_argv));
        memcpy(new_cmdln->f_argv + new_cmdln->f_argc, argv,
               argc * sizeof(*argv));
        ckd_free(argv);
        new_cmdln->f_argc += argc;
    }
    else {
        /* Otherwise, store f_argc and f_argv. */
        new_cmdln->f_argc = argc;
        new_cmdln->f_argv = argv;
    }

    return new_cmdln;
}